

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

int Abc_NodeMakeLegit(Abc_Obj_t *pNode)

{
  int iVar1;
  int i;
  uint uVar2;
  
  iVar1 = 1;
  uVar2 = 0;
  while (iVar1 != 0) {
    Abc_NodeMakeDist1Free(pNode);
    iVar1 = Abc_NodeMakeSCCFree(pNode);
    uVar2 = uVar2 + 1;
  }
  return (int)(1 < uVar2);
}

Assistant:

int Abc_NodeMakeLegit( Abc_Obj_t * pNode )
{
    int i, fChanges = 1;
    for ( i = 0; fChanges; i++ )
    {
        Abc_NodeMakeDist1Free( pNode );
        fChanges = Abc_NodeMakeSCCFree( pNode );
    }
//    Abc_NodeCheckDist1Free( pNode );
    return i > 1;
}